

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_various.cpp
# Opt level: O3

void lsim::sim_register_various_functions(Simulator *sim)

{
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:12:5)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:12:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,1,0,(simulation_func_t *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:28:5)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:28:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,1,2,(simulation_func_t *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:40:5)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:40:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,3,0,(simulation_func_t *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:45:5)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:45:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,4,0,(simulation_func_t *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:51:5)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:51:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x21,0,(simulation_func_t *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:62:5)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:62:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x21,2,(simulation_func_t *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:73:5)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:73:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x101,0,(simulation_func_t *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:77:5)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(lsim::Simulator_*,_lsim::SimComponent_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_various.cpp:77:5)>
             ::_M_manager;
  Simulator::register_sim_function(sim,0x101,2,(simulation_func_t *)&local_108);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  return;
}

Assistant:

void sim_register_various_functions(Simulator *sim) {
    SIM_SETUP_FUNC_BEGIN(CONNECTOR_IN) {
        if (!comp->user_values_enabled()) {
            return;
        }
        for (auto pin = 0u; pin < comp->num_outputs(); ++pin) {
            auto user_value = comp->user_value(comp->output_pin_index(pin));
            if (user_value != VALUE_UNDEFINED) {
                sim->pin_set_initial_value(comp->pin_by_index(pin), user_value);
                sim->pin_set_output_value(comp->pin_by_index(pin), user_value);
            }
        }

        // disable the independent simulation function until the user interacts with the connector
        sim->deactivate_independent_simulation_func(comp);
    } SIM_FUNC_END;

    SIM_INDEPENDENT_FUNC_BEGIN(CONNECTOR_IN) {
        for (auto pin = 0u; pin < comp->num_outputs(); ++pin) {
            auto last_value = sim->pin_output_value(comp->pin_by_index(comp->output_pin_index(pin)));
            auto user_value = comp->user_value(comp->output_pin_index(pin));
            if (last_value != user_value || user_value != VALUE_UNDEFINED) {
                comp->write_pin(pin, user_value);
            }
        }

        sim->deactivate_independent_simulation_func(comp);
    } SIM_FUNC_END;

    SIM_SETUP_FUNC_BEGIN(CONSTANT)  {
        auto value = comp->description()->property("value")->value_as_lsim_value();
        sim->pin_set_initial_value(comp->pin_by_index(0), value);
    } SIM_FUNC_END;

    SIM_SETUP_FUNC_BEGIN(PULL_RESISTOR) {
        auto value = comp->description()->property("pull_to")->value_as_lsim_value();
        sim->pin_set_default(comp->pin_by_index(0), value);
        sim->pin_set_initial_value(comp->pin_by_index(0), value);
    } SIM_FUNC_END;

    SIM_SETUP_FUNC_BEGIN(OSCILLATOR) {
        comp->set_extra_data_size(sizeof(ExtraDataOscillator));
        auto *extra = reinterpret_cast<ExtraDataOscillator *>(comp->extra_data());

        auto value = sim->pin_output_value(comp->pin_by_index(0));

        extra->m_duration[0] = comp->description()->property_value("low_duration", static_cast<int64_t>(1));
        extra->m_duration[1] = comp->description()->property_value("high_duration", static_cast<int64_t>(1));
        extra->m_next_change = sim->current_time() + extra->m_duration[value];
    } SIM_FUNC_END;

    SIM_INDEPENDENT_FUNC_BEGIN(OSCILLATOR) {
        auto *extra = reinterpret_cast<ExtraDataOscillator *>(comp->extra_data());
        if (sim->current_time() >= extra->m_next_change) {
            auto cur_value = sim->pin_output_value(comp->pin_by_index(0));
            auto new_value = cur_value == VALUE_TRUE ? VALUE_FALSE : VALUE_TRUE;
            
            extra->m_next_change = sim->current_time() + extra->m_duration[new_value];
            comp->write_pin(comp->output_pin_index(0), new_value);
        }
    } SIM_FUNC_END;

    SIM_SETUP_FUNC_BEGIN(7_SEGMENT_LED) {
        comp->set_extra_data_size(sizeof(ExtraData7SegmentLED));
    } SIM_FUNC_END;

    SIM_INDEPENDENT_FUNC_BEGIN(7_SEGMENT_LED) {
        auto *extra = reinterpret_cast<ExtraData7SegmentLED *>(comp->extra_data());
        auto led_on = comp->read_pin(comp->control_pin_index(0));

        if (led_on == VALUE_TRUE) {
            for (auto pin_idx = 0u; pin_idx < comp->num_inputs(); ++pin_idx) {
                extra->m_samples[pin_idx] += comp->read_pin(comp->input_pin_index(pin_idx)) == VALUE_TRUE ? 1: 0;
            }
        }
        extra->m_num_samples += 1;
    } SIM_FUNC_END;
}